

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

bool Js::JavascriptArray::Jit_TryGetArrayForObjectWithArray
               (Var var,bool *isObjectWithArrayRef,INT_PTR *pVTable,JavascriptArray **pArray)

{
  ArrayObject *obj;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *this;
  JavascriptArray *pJVar4;
  
  if (isObjectWithArrayRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27d,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) goto LAB_00b7a4dd;
    *puVar3 = 0;
  }
  if (pVTable == (INT_PTR *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27e,"(pVTable)","pVTable");
    if (!bVar2) goto LAB_00b7a4dd;
    *puVar3 = 0;
  }
  if (pArray == (JavascriptArray **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27f,"(pArray)","pArray");
    if (!bVar2) {
LAB_00b7a4dd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((*pVTable != VirtualTableInfo<Js::DynamicObject>::Address) &&
     (*pVTable != VirtualTableInfo<Js::CrossSiteObject<Js::DynamicObject>_>::Address)) {
    return true;
  }
  this = VarTo<Js::DynamicObject>(var);
  bVar2 = DynamicObject::HasObjectArray(this);
  obj = *(ArrayObject **)&(this->field_1).field_1;
  if ((obj == (ArrayObject *)0x0 || !bVar2) || (bVar2 = DynamicObject::IsAnyArray(obj), !bVar2)) {
    pJVar4 = (JavascriptArray *)0x0;
  }
  else {
    pJVar4 = VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
  }
  *pArray = pJVar4;
  if (pJVar4 != (JavascriptArray *)0x0) {
    *isObjectWithArrayRef = true;
    *pVTable = (INT_PTR)(pJVar4->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject;
  }
  return pJVar4 != (JavascriptArray *)0x0;
}

Assistant:

bool JavascriptArray::Jit_TryGetArrayForObjectWithArray(const Var var, bool *const isObjectWithArrayRef, INT_PTR* pVTable, JavascriptArray** pArray)
    {
        Assert(isObjectWithArrayRef);
        Assert(pVTable);
        Assert(pArray);

        if (*pVTable == VirtualTableInfo<DynamicObject>::Address ||
            *pVTable == VirtualTableInfo<CrossSiteObject<DynamicObject>>::Address)
        {
            ArrayObject* objectArray = VarTo<DynamicObject>(var)->GetObjectArray();
            *pArray = (objectArray && VarIs<JavascriptArray>(objectArray)) ? VarTo<JavascriptArray>(objectArray) : nullptr;
            if (!(*pArray))
            {
                return false;
            }
            *isObjectWithArrayRef = true;
            *pVTable = VirtualTableInfoBase::GetVirtualTable(*pArray);
        }
        return true;
    }